

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void * duckdb_je_arena_palloc
                 (tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool zero,_Bool slab,
                 tcache_t *tcache)

{
  void **ppvVar1;
  void **ppvVar2;
  bool bVar3;
  szind_t sVar4;
  ulong uVar5;
  arena_t *arena_00;
  void *pvVar6;
  void *pvVar7;
  undefined7 in_register_00000089;
  cache_bin_t *cache_bin;
  _Bool local_45;
  szind_t local_44;
  void *local_40;
  ulong local_38;
  
  if ((int)CONCAT71(in_register_00000089,slab) == 0) {
    if (alignment < 0x41) {
      pvVar6 = duckdb_je_large_malloc(tsdn,arena,usize,zero);
      return pvVar6;
    }
    pvVar6 = duckdb_je_large_palloc(tsdn,arena,usize,alignment,zero);
    return pvVar6;
  }
  if (usize < 0x1001) {
    uVar5 = (ulong)duckdb_je_sz_size2index_tab[usize + 7 >> 3];
  }
  else {
    sVar4 = sz_size2index_compute(usize);
    uVar5 = (ulong)sVar4;
  }
  if (tcache == (tcache_t *)0x0) {
    pvVar6 = duckdb_je_arena_malloc_hard(tsdn,arena,usize,(szind_t)uVar5,zero,true);
    return pvVar6;
  }
  cache_bin = tcache->bins + uVar5;
  ppvVar2 = cache_bin->stack_head;
  pvVar6 = *ppvVar2;
  ppvVar1 = ppvVar2 + 1;
  if (cache_bin->low_bits_low_water == (uint16_t)ppvVar2) {
    if (cache_bin->low_bits_empty != (uint16_t)ppvVar2) {
      cache_bin->stack_head = ppvVar1;
      cache_bin->low_bits_low_water = (uint16_t)ppvVar1;
      goto LAB_01d8ff6c;
    }
    bVar3 = false;
    pvVar6 = (void *)0x0;
  }
  else {
    cache_bin->stack_head = ppvVar1;
LAB_01d8ff6c:
    bVar3 = true;
  }
  if (bVar3) goto LAB_01d8ff76;
  local_44 = (szind_t)uVar5;
  local_40 = pvVar6;
  local_38 = uVar5;
  arena_00 = arena_choose(&tsdn->tsd,arena);
  sVar4 = local_44;
  if (arena_00 == (arena_t *)0x0) {
    pvVar7 = (void *)0x0;
LAB_01d900f4:
    local_45 = false;
    pvVar6 = local_40;
  }
  else {
    if (cache_bin->stack_head == (void **)&duckdb_je_disabled_bin) {
      pvVar7 = duckdb_je_arena_malloc_hard(tsdn,arena_00,usize,local_44,zero,true);
      goto LAB_01d900f4;
    }
    duckdb_je_tcache_bin_flush_stashed(&tsdn->tsd,tcache,cache_bin,local_44,true);
    pvVar6 = duckdb_je_tcache_alloc_small_hard(tsdn,arena_00,tcache,cache_bin,sVar4,&local_45);
    pvVar7 = (void *)0x0;
  }
  uVar5 = local_38;
  if (local_45 == false) {
    return pvVar7;
  }
LAB_01d8ff76:
  if (zero) {
    switchD_01306cb1::default(pvVar6,0,duckdb_je_sz_index2size_tab[uVar5]);
  }
  (cache_bin->tstats).nrequests = (cache_bin->tstats).nrequests + 1;
  return pvVar6;
}

Assistant:

void *
arena_palloc(tsdn_t *tsdn, arena_t *arena, size_t usize, size_t alignment,
    bool zero, bool slab, tcache_t *tcache) {
	if (slab) {
		assert(sz_can_use_slab(usize));
		/* Small; alignment doesn't require special slab placement. */

		/* usize should be a result of sz_sa2u() */
		assert((usize & (alignment - 1)) == 0);

		/*
		 * Small usize can't come from an alignment larger than a page.
		 */
		assert(alignment <= PAGE);

		return arena_malloc(tsdn, arena, usize, sz_size2index(usize),
		    zero, slab, tcache, true);
	} else {
		if (likely(alignment <= CACHELINE)) {
			return large_malloc(tsdn, arena, usize, zero);
		} else {
			return large_palloc(tsdn, arena, usize, alignment, zero);
		}
	}
}